

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab2njd.c
# Opt level: O0

void mecab2njd(NJD *njd,char **feature,int size)

{
  NJDNode *node_00;
  int in_EDX;
  NJD *in_RDI;
  NJDNode *node;
  int i;
  char *in_stack_00001808;
  NJDNode *in_stack_00001810;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    node_00 = (NJDNode *)calloc(1,0x78);
    NJDNode_initialize(node_00);
    NJDNode_load(in_stack_00001810,in_stack_00001808);
    NJD_push_node(in_RDI,node_00);
  }
  return;
}

Assistant:

void mecab2njd(NJD * njd, char **feature, int size)
{
   int i;
   NJDNode *node;

   for (i = 0; i < size; i++) {
      node = (NJDNode *) calloc(1, sizeof(NJDNode));
      NJDNode_initialize(node);
      NJDNode_load(node, feature[i]);
      NJD_push_node(njd, node);
   }
}